

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_buffer.cpp
# Opt level: O3

bool template_image::Constructor(void)

{
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint8_t alignment_;
  uint uVar6;
  uint8_t colorCount_;
  ImageTemplate<unsigned_char> local_58;
  
  uVar2 = Test_Helper::runCount();
  if (uVar2 == 0) {
    bVar1 = true;
  }
  else {
    uVar6 = 0;
    do {
      uVar3 = rand();
      uVar3 = uVar3 & 0x7ff;
      uVar4 = rand();
      uVar5 = rand();
      colorCount_ = (uint8_t)(uVar5 & 3);
      if ((uVar5 & 3) == 0) {
        colorCount_ = '\x01';
      }
      uVar5 = rand();
      alignment_ = (uint8_t)(uVar5 & 0x1f);
      if ((uVar5 & 0x1f) == 0) {
        alignment_ = '\x01';
      }
      PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
                (&local_58,uVar3,uVar4 & 0x7ff,colorCount_,alignment_);
      uVar2 = Unit_Test::rowSize(uVar3,colorCount_,alignment_);
      bVar1 = Unit_Test::equalSize<PenguinV_Image::ImageTemplate<unsigned_char>>
                        (&local_58,uVar3,uVar4 & 0x7ff,uVar2,colorCount_,alignment_);
      local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
      PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
      if (!bVar1) {
        return bVar1;
      }
      uVar6 = uVar6 + 1;
      uVar2 = Test_Helper::runCount();
    } while (uVar6 < uVar2);
  }
  return bVar1;
}

Assistant:

bool Constructor()
    {
        for( uint32_t i = 0; i < Unit_Test::runCount(); ++i ) {
            const uint32_t width      = Unit_Test::randomValue<uint32_t>( 2048 );
            const uint32_t height     = Unit_Test::randomValue<uint32_t>( 2048 );
            const uint8_t  colorCount = Unit_Test::randomValue<uint8_t >( 1, 4 );
            const uint8_t  alignment  = Unit_Test::randomValue<uint8_t >( 1, 32 );

            if( !Unit_Test::equalSize( PenguinV_Image::ImageTemplate < uint8_t >( width, height, colorCount, alignment ), width, height,
                                       Unit_Test::rowSize( width, colorCount, alignment ), colorCount, alignment ) )
                return false;
        }

        return true;
    }